

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O0

void bloaty::dwarf::SkipLEB128(string_view *data)

{
  size_type sVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_t i;
  size_t limit;
  char *local_28;
  unsigned_long local_20;
  char *str;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  local_20 = 10;
  puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffe8,&local_20);
  str = (char *)*puVar2;
  local_28 = (char *)0x0;
  while( true ) {
    if (str <= local_28) {
      Throw(str,(int)(sVar1 >> 0x20));
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (in_RDI,(size_type)local_28);
    if (((int)*pvVar3 & 0x80U) == 0) break;
    local_28 = local_28 + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            (in_RDI,(size_type)(local_28 + 1));
  return;
}

Assistant:

void SkipLEB128(string_view* data) {
  size_t limit =
      std::min(static_cast<size_t>(data->size()), static_cast<size_t>(10));
  for (size_t i = 0; i < limit; i++) {
    if (((*data)[i] & 0x80) == 0) {
      data->remove_prefix(i + 1);
      return;
    }
  }

  THROW("corrupt DWARF data, unterminated LEB128");
}